

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O0

void __thiscall TTD::UtilSupport::TTAutoString::Append(TTAutoString *this,uint64 val)

{
  Memory *this_00;
  char16_t *pcVar1;
  TrackAllocData local_40;
  uint64 local_18;
  uint64 val_local;
  TTAutoString *this_local;
  
  local_18 = val;
  val_local = (uint64)this;
  if (this->m_optFormatBuff == (char16 *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&char16_t::typeinfo,0,0x40,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSupport.cpp"
               ,200);
    this_00 = (Memory *)
              Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
    pcVar1 = Memory::AllocateArray<Memory::HeapAllocator,char16_t,true>
                       (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAllocZero,0,0x40);
    pcVar1 = TTD_MEM_ALLOC_CHECK<char16_t>(pcVar1);
    this->m_optFormatBuff = pcVar1;
  }
  swprintf_s((char16_t_conflict *)this->m_optFormatBuff,0x20,(char16_t_conflict *)L"%I64u",local_18)
  ;
  Append(this,this->m_optFormatBuff,0,0xffffffffffffffff);
  return;
}

Assistant:

void TTAutoString::Append(uint64 val)
        {
            if(this->m_optFormatBuff == nullptr)
            {
                this->m_optFormatBuff = TT_HEAP_ALLOC_ARRAY_ZERO(char16, 64);
            }

            swprintf_s(this->m_optFormatBuff, 32, _u("%I64u"), val); //64 char16s is 32 words

            this->Append(this->m_optFormatBuff);
        }